

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall M2TSStreamInfo::M2TSStreamInfo(M2TSStreamInfo *this,M2TSStreamInfo *other)

{
  StreamType SVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  
  (this->m_index).
  super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_index).
  super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_index).
  super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVar1 = other->stream_coding_type;
  this->streamPID = other->streamPID;
  this->stream_coding_type = SVar1;
  this->video_format = other->video_format;
  this->frame_rate_index = other->frame_rate_index;
  uVar2 = other->width;
  uVar3 = other->height;
  iVar4 = other->HDR;
  this->number_of_offset_sequences = other->number_of_offset_sequences;
  this->width = uVar2;
  this->height = uVar3;
  this->HDR = iVar4;
  uVar5 = other->audio_presentation_type;
  uVar6 = other->sampling_frequency_index;
  uVar7 = other->character_code;
  this->aspect_ratio_index = other->aspect_ratio_index;
  this->audio_presentation_type = uVar5;
  this->sampling_frequency_index = uVar6;
  this->character_code = uVar7;
  *(undefined4 *)this->language_code = *(undefined4 *)other->language_code;
  this->isSecondary = other->isSecondary;
  std::
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ::operator=(&this->m_index,&other->m_index);
  return;
}

Assistant:

M2TSStreamInfo::M2TSStreamInfo(const M2TSStreamInfo& other)
{
    streamPID = other.streamPID;
    stream_coding_type = other.stream_coding_type;
    video_format = other.video_format;
    frame_rate_index = other.frame_rate_index;
    number_of_offset_sequences = other.number_of_offset_sequences;
    width = other.width;
    height = other.height;
    HDR = other.HDR;
    aspect_ratio_index = other.aspect_ratio_index;
    audio_presentation_type = other.audio_presentation_type;
    sampling_frequency_index = other.sampling_frequency_index;
    character_code = other.character_code;
    memcpy(language_code, other.language_code, sizeof(language_code));
    isSecondary = other.isSecondary;
    m_index = other.m_index;
}